

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O2

void PatchImproveGoldRewardsHandling::handle_gold_rewards_for_npc
               (ROM *rom,uint32_t function_check_gold_reward)

{
  uint32_t address;
  Code *code;
  Param local_138;
  ulong local_130;
  undefined1 local_128 [32];
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_e0;
  Code proc_check_if_item_is_golds;
  
  proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  proc_check_if_item_is_golds._bytes.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  proc_check_if_item_is_golds._bytes.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  proc_check_if_item_is_golds._bytes.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = proc_check_if_item_is_golds._pending_branches._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::clrl(&proc_check_if_item_is_golds,(Param *)local_128);
  local_128._0_8_ = &PTR_getXn_00246ce8;
  local_128._8_8_ = (pointer)0x200ff1196;
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::movew(&proc_check_if_item_is_golds,(Param *)local_128,&local_138);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::cmpiw(&proc_check_if_item_is_golds,0x7f,(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_archipelago",(allocator<char> *)&local_138);
  md::Code::bne(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::movew(&proc_check_if_item_is_golds,0x1e,(Param *)local_128);
  md::Code::jmp(&proc_check_if_item_is_golds,0x28ed2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_archipelago",(allocator<char> *)&local_138);
  md::Code::label(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::cmpiw(&proc_check_if_item_is_golds,0x40,(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_golds",(allocator<char> *)&local_138);
  md::Code::blt(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::subiw(&proc_check_if_item_is_golds,0x40,(Param *)local_128);
  md::Code::jsr(&proc_check_if_item_is_golds,function_check_gold_reward);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  local_130 = 0x200ff1878;
  md::Code::movel(&proc_check_if_item_is_golds,(Param *)local_128,&local_138);
  md::Code::jmp(&proc_check_if_item_is_golds,0x28ef0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_golds",(allocator<char> *)&local_138);
  md::Code::label(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::cmpiw(&proc_check_if_item_is_golds,0x3f,(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_empty",(allocator<char> *)&local_138);
  md::Code::bne(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::movew(&proc_check_if_item_is_golds,0x1d,(Param *)local_128);
  md::Code::jmp(&proc_check_if_item_is_golds,0x28ed2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"item_not_empty",(allocator<char> *)&local_138);
  md::Code::label(&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  md::Code::jmp(&proc_check_if_item_is_golds,0x28eca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"",(allocator<char> *)&local_138);
  address = md::ROM::inject_code(rom,&proc_check_if_item_is_golds,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_108._M_left = &local_108;
  _Stack_e0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8 = 0;
  _Stack_e0._0_8_ = 0;
  local_108._M_color = _S_red;
  local_108._4_4_ = 0;
  local_108._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  local_128._24_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0.super__Rb_tree_header._M_header._M_left = &_Stack_e0.super__Rb_tree_header._M_header;
  _Stack_e0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0.super__Rb_tree_header._M_node_count = 0;
  local_108._M_right = local_108._M_left;
  _Stack_e0.super__Rb_tree_header._M_header._M_right =
       _Stack_e0.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_128,address);
  md::ROM::set_code(rom,0x28ec4,code);
  md::Code::~Code((Code *)local_128);
  md::Code::~Code(&proc_check_if_item_is_golds);
  return;
}

Assistant:

static void handle_gold_rewards_for_npc(md::ROM& rom, uint32_t function_check_gold_reward)
    {
        constexpr uint32_t JUMP_ADDR_ITEM_REWARD = 0x28ECA;
        constexpr uint32_t JUMP_ADDR_GOLD_REWARD = 0x28EF0;
        constexpr uint32_t JUMP_ADDR_NO_REWARD = 0x28ED2;

        md::Code proc_check_if_item_is_golds;
        {
            proc_check_if_item_is_golds.clrl(reg_D0);
            proc_check_if_item_is_golds.movew(addr_(0xFF1196), reg_D0);
            proc_check_if_item_is_golds.cmpiw(ITEM_ARCHIPELAGO, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_archipelago");
            {
                // Archipelago item case
                proc_check_if_item_is_golds.movew(0x1E, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_archipelago");
            proc_check_if_item_is_golds.cmpiw(ITEM_GOLDS_START, reg_D0);
            proc_check_if_item_is_golds.blt("item_not_golds");
            {
                // Gold reward case
                proc_check_if_item_is_golds.subiw(ITEM_GOLDS_START, reg_D0);
                proc_check_if_item_is_golds.jsr(function_check_gold_reward);
                proc_check_if_item_is_golds.movel(reg_D0, addr_(0xFF1878));
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_GOLD_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_golds");
            proc_check_if_item_is_golds.cmpiw(ITEM_NONE, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_empty");
            {
                // No item case
                proc_check_if_item_is_golds.movew(0x1D, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_empty");
            // Item reward case
            proc_check_if_item_is_golds.jmp(JUMP_ADDR_ITEM_REWARD);
        }
        uint32_t addr = rom.inject_code(proc_check_if_item_is_golds);

        rom.set_code(0x28EC4, md::Code().jmp(addr));
    }